

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void printHeader(FILE *socketFile,int command,FILE *requestedFile)

{
  FILE *requestedFile_local;
  int command_local;
  FILE *socketFile_local;
  
  if (command == 200) {
    fputs("HTTP/1.1 200 OK\r\n",(FILE *)socketFile);
    sendDate(socketFile);
    sendContentLength(socketFile,requestedFile);
  }
  else if (command == 0x194) {
    fputs("HTTP/1.1 404 Not found\r\n",(FILE *)socketFile);
  }
  else if (command != 0x1f5) {
    fprintf(_stderr,"%s ERROR: ",fileName);
    fprintf(_stderr,"invalid return value given");
    fprintf(_stderr,"\n");
    exit(1);
  }
  fprintf((FILE *)socketFile,"Connection: close\r\n");
  fprintf((FILE *)socketFile,"\r\n");
  return;
}

Assistant:

static void printHeader(FILE* socketFile, int command,FILE *requestedFile) {
	switch(command){
		case 501:
			break;
			fputs("HTTP/1.1 501 Not implemented\r\n", socketFile);
		case 404:
			fputs("HTTP/1.1 404 Not found\r\n", socketFile);
			break;
		case 200:
			fputs("HTTP/1.1 200 OK\r\n", socketFile);
			sendDate(socketFile);
			sendContentLength(socketFile, requestedFile);
			break;
		default:
			ERROR_EXIT("invalid return value given");
			break;
	}
	fprintf(socketFile, "Connection: close\r\n");
	fprintf(socketFile, "\r\n");
}